

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20.c
# Opt level: O3

void chacha20_encrypt_block(uint32_t *ctx,uint8_t *out,uint32_t incr,uint8_t *text)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  int iVar37;
  
  uVar1 = ctx[9];
  uVar2 = ctx[0xd];
  uVar4 = ctx[1];
  uVar5 = ctx[2];
  uVar6 = ctx[3];
  uVar7 = ctx[4];
  uVar8 = ctx[5];
  uVar9 = ctx[6];
  uVar10 = ctx[7];
  uVar11 = ctx[8];
  uVar44 = uVar8 + uVar4;
  uVar45 = uVar9 + uVar5;
  uVar46 = uVar10 + uVar6;
  uVar39 = uVar2 ^ uVar44;
  uVar40 = uVar39 << 0x10 | uVar39 >> 0x10;
  uVar18 = uVar1 + uVar40;
  uVar39 = ctx[5] ^ uVar18;
  uVar39 = uVar39 << 0xc | uVar39 >> 0x14;
  uVar44 = uVar44 + uVar39;
  uVar40 = uVar40 ^ uVar44;
  uVar41 = uVar40 << 8 | uVar40 >> 0x18;
  uVar18 = uVar18 + uVar41;
  uVar39 = uVar39 ^ uVar18;
  uVar30 = uVar39 << 7 | uVar39 >> 0x19;
  uVar39 = ctx[0xe];
  uVar40 = uVar39 ^ uVar45;
  uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
  iVar37 = (int)*(undefined8 *)(ctx + 10);
  uVar36 = iVar37 + uVar40;
  uVar33 = ctx[6] ^ uVar36;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar45 = uVar45 + uVar33;
  uVar40 = uVar40 ^ uVar45;
  uVar27 = uVar40 << 8 | uVar40 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar33 = uVar33 ^ uVar36;
  uVar34 = uVar33 << 7 | uVar33 >> 0x19;
  uVar40 = ctx[0xf];
  uVar33 = uVar40 ^ uVar46;
  uVar33 = uVar33 << 0x10 | uVar33 >> 0x10;
  iVar43 = (int)((ulong)*(undefined8 *)(ctx + 10) >> 0x20);
  uVar20 = iVar43 + uVar33;
  uVar23 = ctx[7] ^ uVar20;
  uVar24 = uVar23 << 0xc | uVar23 >> 0x14;
  uVar46 = uVar46 + uVar24;
  uVar33 = uVar33 ^ uVar46;
  uVar23 = uVar33 << 8 | uVar33 >> 0x18;
  uVar20 = uVar20 + uVar23;
  uVar24 = uVar24 ^ uVar20;
  uVar25 = uVar24 << 7 | uVar24 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar41 = uVar41 ^ uVar45;
  uVar24 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar44 = uVar44 + uVar34;
  uVar3 = ctx[0xc];
  uVar38 = ctx[4] + *ctx;
  uVar33 = incr + uVar3 ^ uVar38;
  uVar41 = uVar33 << 0x10 | uVar33 >> 0x10;
  uVar42 = ctx[8] + uVar41;
  uVar33 = ctx[4] ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar30;
  uVar23 = uVar23 ^ uVar38;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar30;
  uVar23 = uVar23 ^ uVar38;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar36 = uVar36 + uVar23;
  uVar30 = uVar30 ^ uVar36;
  uVar31 = uVar30 << 7 | uVar30 >> 0x19;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar34 = uVar34 ^ uVar20;
  uVar30 = uVar34 << 0xc | uVar34 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar41;
  uVar30 = uVar30 ^ uVar20;
  uVar34 = uVar30 << 7 | uVar30 >> 0x19;
  uVar42 = uVar42 + uVar24;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar24 = uVar24 ^ uVar45;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar42 = uVar42 + uVar24;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar30 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar30;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar24 = uVar24 ^ uVar44;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar18 = uVar18 + uVar24;
  uVar31 = uVar31 ^ uVar18;
  uVar41 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar41;
  uVar24 = uVar24 ^ uVar44;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar18 = uVar18 + uVar24;
  uVar41 = uVar41 ^ uVar18;
  uVar31 = uVar41 << 7 | uVar41 >> 0x19;
  uVar45 = uVar45 + uVar34;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar34 = uVar34 ^ uVar36;
  uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
  uVar45 = uVar45 + uVar34;
  uVar27 = uVar27 ^ uVar45;
  uVar41 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar41;
  uVar34 = uVar34 ^ uVar36;
  uVar34 = uVar34 << 7 | uVar34 >> 0x19;
  uVar46 = uVar46 + uVar25;
  uVar23 = uVar23 ^ uVar46;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar20 = uVar20 + uVar23;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar23 = uVar23 ^ uVar46;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar20 = uVar20 + uVar23;
  uVar25 = uVar25 ^ uVar20;
  uVar27 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar31;
  uVar23 = uVar23 ^ uVar38;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar38 = uVar38 + uVar31;
  uVar23 = uVar23 ^ uVar38;
  uVar25 = uVar23 << 8 | uVar23 >> 0x18;
  uVar36 = uVar36 + uVar25;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar44 = uVar44 + uVar34;
  uVar30 = uVar30 ^ uVar44;
  uVar23 = uVar30 << 0x10 | uVar30 >> 0x10;
  uVar20 = uVar20 + uVar23;
  uVar34 = uVar34 ^ uVar20;
  uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
  uVar44 = uVar44 + uVar34;
  uVar23 = uVar23 ^ uVar44;
  uVar30 = uVar23 << 8 | uVar23 >> 0x18;
  uVar20 = uVar20 + uVar30;
  uVar34 = uVar34 ^ uVar20;
  uVar34 = uVar34 << 7 | uVar34 >> 0x19;
  uVar45 = uVar45 + uVar27;
  uVar24 = uVar24 ^ uVar45;
  uVar23 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar27 = uVar27 ^ uVar42;
  uVar24 = uVar27 << 0xc | uVar27 >> 0x14;
  uVar45 = uVar45 + uVar24;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar24 = uVar24 ^ uVar42;
  uVar27 = uVar24 << 7 | uVar24 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar41 = uVar41 ^ uVar46;
  uVar24 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar18 = uVar18 + uVar24;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar18 = uVar18 + uVar24;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar30 = uVar30 ^ uVar38;
  uVar41 = uVar30 << 0x10 | uVar30 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar30 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar30;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar41 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar41;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar41 = uVar41 ^ uVar18;
  uVar31 = uVar41 << 7 | uVar41 >> 0x19;
  uVar45 = uVar45 + uVar34;
  uVar24 = uVar24 ^ uVar45;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar34 = uVar34 ^ uVar36;
  uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
  uVar45 = uVar45 + uVar34;
  uVar24 = uVar24 ^ uVar45;
  uVar41 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar41;
  uVar34 = uVar34 ^ uVar36;
  uVar34 = uVar34 << 7 | uVar34 >> 0x19;
  uVar46 = uVar46 + uVar27;
  uVar25 = uVar25 ^ uVar46;
  uVar24 = uVar25 << 0x10 | uVar25 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar27 = uVar27 ^ uVar20;
  uVar25 = uVar27 << 0xc | uVar27 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar31;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar31 = uVar31 ^ uVar36;
  uVar27 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar38 = uVar38 + uVar27;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar24;
  uVar27 = uVar27 ^ uVar36;
  uVar31 = uVar27 << 7 | uVar27 >> 0x19;
  uVar44 = uVar44 + uVar34;
  uVar30 = uVar30 ^ uVar44;
  uVar27 = uVar30 << 0x10 | uVar30 >> 0x10;
  uVar20 = uVar20 + uVar27;
  uVar34 = uVar34 ^ uVar20;
  uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
  uVar44 = uVar44 + uVar34;
  uVar27 = uVar27 ^ uVar44;
  uVar30 = uVar27 << 8 | uVar27 >> 0x18;
  uVar20 = uVar20 + uVar30;
  uVar34 = uVar34 ^ uVar20;
  uVar34 = uVar34 << 7 | uVar34 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar41 = uVar41 ^ uVar46;
  uVar27 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar30 = uVar30 ^ uVar38;
  uVar41 = uVar30 << 0x10 | uVar30 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar30 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar45 = uVar45 + uVar34;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar34 = uVar34 ^ uVar36;
  uVar31 = uVar34 << 0xc | uVar34 >> 0x14;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar44 = uVar44 + uVar31;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar41;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 7 | uVar31 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar18 = uVar18 + uVar27;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar38 = uVar38 + uVar33;
  uVar41 = uVar41 ^ uVar38;
  uVar41 = uVar41 << 8 | uVar41 >> 0x18;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar44 = uVar44 + uVar30;
  uVar23 = uVar23 ^ uVar44;
  uVar23 = uVar23 << 8 | uVar23 >> 0x18;
  uVar18 = uVar18 + uVar23;
  uVar30 = uVar30 ^ uVar18;
  uVar30 = uVar30 << 7 | uVar30 >> 0x19;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar31 = uVar31 ^ uVar36;
  uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
  uVar45 = uVar45 + uVar31;
  uVar27 = uVar27 ^ uVar45;
  uVar27 = uVar27 << 8 | uVar27 >> 0x18;
  uVar36 = uVar36 + uVar27;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar20 = uVar20 + uVar24;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar46 = uVar46 + uVar25;
  uVar24 = uVar24 ^ uVar46;
  uVar24 = uVar24 << 8 | uVar24 >> 0x18;
  uVar31 = uVar31 ^ uVar36;
  uVar20 = uVar20 + uVar24;
  uVar38 = uVar38 + uVar30;
  uVar24 = uVar24 ^ uVar38;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  uVar36 = uVar36 + uVar24;
  uVar30 = uVar30 ^ uVar36;
  uVar32 = uVar30 << 0xc | uVar30 >> 0x14;
  uVar38 = uVar38 + uVar32;
  uVar24 = uVar24 ^ uVar38;
  uVar42 = uVar42 + uVar41;
  uVar33 = uVar33 ^ uVar42;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 7 | uVar25 >> 0x19;
  uVar45 = uVar45 + uVar25;
  uVar23 = uVar23 ^ uVar45;
  uVar23 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar42 = uVar42 + uVar23;
  uVar25 = uVar25 ^ uVar42;
  uVar26 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar45 = uVar45 + uVar26;
  uVar23 = uVar23 ^ uVar45;
  uVar25 = uVar31 << 7 | uVar31 >> 0x19;
  uVar44 = uVar44 + uVar25;
  uVar41 = uVar41 ^ uVar44;
  uVar41 = uVar41 << 0x10 | uVar41 >> 0x10;
  uVar20 = uVar20 + uVar41;
  uVar25 = uVar25 ^ uVar20;
  uVar35 = uVar25 << 0xc | uVar25 >> 0x14;
  uVar44 = uVar44 + uVar35;
  uVar41 = uVar41 ^ uVar44;
  uVar33 = uVar33 << 7 | uVar33 >> 0x19;
  uVar46 = uVar46 + uVar33;
  uVar27 = uVar27 ^ uVar46;
  uVar25 = uVar27 << 0x10 | uVar27 >> 0x10;
  uVar18 = uVar18 + uVar25;
  uVar33 = uVar33 ^ uVar18;
  uVar19 = uVar33 << 0xc | uVar33 >> 0x14;
  uVar46 = uVar46 + uVar19;
  uVar25 = uVar25 ^ uVar46;
  uVar28 = uVar25 << 8 | uVar25 >> 0x18;
  uVar18 = uVar18 + uVar28;
  uVar19 = uVar19 ^ uVar18;
  uVar21 = uVar23 << 8 | uVar23 >> 0x18;
  uVar42 = uVar42 + uVar21;
  uVar26 = uVar26 ^ uVar42;
  uVar29 = uVar41 << 8 | uVar41 >> 0x18;
  uVar20 = uVar20 + uVar29;
  uVar35 = uVar35 ^ uVar20;
  uVar22 = uVar24 << 8 | uVar24 >> 0x18;
  uVar36 = uVar36 + uVar22;
  uVar32 = uVar32 ^ uVar36;
  uVar31 = *(uint *)(text + 4);
  uVar34 = *(uint *)(text + 8);
  uVar12 = *(uint *)(text + 0xc);
  uVar13 = *(uint *)(text + 0x10);
  uVar14 = *(uint *)(text + 0x14);
  uVar15 = *(uint *)(text + 0x18);
  uVar16 = *(uint *)(text + 0x1c);
  uVar17 = *(uint *)(text + 0x20);
  uVar33 = *(uint *)(text + 0x34);
  uVar23 = *(uint *)(text + 0x38);
  uVar25 = *(uint *)(text + 0x24);
  uVar27 = *(uint *)(text + 0x28);
  uVar41 = *(uint *)(text + 0x2c);
  uVar30 = *(uint *)(text + 0x30);
  uVar24 = *(uint *)(text + 0x3c);
  *(uint *)out = uVar38 + *ctx ^ *(uint *)text;
  *(uint *)(out + 4) = uVar44 + uVar4 ^ uVar31;
  *(uint *)(out + 8) = uVar45 + uVar5 ^ uVar34;
  *(uint *)(out + 0xc) = uVar46 + uVar6 ^ uVar12;
  *(uint *)(out + 0x10) = (uVar19 << 7 | uVar19 >> 0x19) + uVar7 ^ uVar13;
  *(uint *)(out + 0x14) = (uVar32 << 7 | uVar32 >> 0x19) + uVar8 ^ uVar14;
  *(uint *)(out + 0x18) = (uVar35 << 7 | uVar35 >> 0x19) + uVar9 ^ uVar15;
  *(uint *)(out + 0x1c) = (uVar26 << 7 | uVar26 >> 0x19) + uVar10 ^ uVar16;
  *(uint *)(out + 0x20) = uVar42 + uVar11 ^ uVar17;
  *(uint32_t *)(out + 0x24) = uVar1 + uVar18 ^ uVar25;
  *(uint *)(out + 0x28) = iVar37 + uVar36 ^ uVar27;
  *(uint *)(out + 0x2c) = iVar43 + uVar20 ^ uVar41;
  *(uint *)(out + 0x30) = uVar29 + incr + uVar3 ^ uVar30;
  *(uint *)(out + 0x34) = uVar21 + uVar2 ^ uVar33;
  *(uint *)(out + 0x38) = uVar28 + uVar39 ^ uVar23;
  *(uint *)(out + 0x3c) = uVar22 + uVar40 ^ uVar24;
  return;
}

Assistant:

static void chacha20_encrypt_block(uint32_t *ctx, uint8_t *out, uint32_t incr, uint8_t *text)
{
  uint32_t k[16U] = { 0U };
  chacha20_core(k, ctx, incr);
  uint32_t bl[16U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = bl;
    uint8_t *bj = text + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = bl;
    uint32_t x = bl[i] ^ k[i];
    os[i] = x;);
  KRML_MAYBE_FOR16(i, 0U, 16U, 1U, store32_le(out + i * 4U, bl[i]););
}